

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

_Bool tbl_IsVictory(void)

{
  ulong uVar1;
  Card_t *pCVar2;
  ulong uVar3;
  SolStack_t *stackPtr;
  
  stackPtr = ColorStacks;
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 4) break;
    pCVar2 = stk_CTopCard(stackPtr);
    if (pCVar2 == (Card_t *)0x0) break;
    stackPtr = stackPtr + 1;
    uVar1 = uVar3 + 1;
  } while (pCVar2->m_type == CT_KING);
  return 3 < uVar3;
}

Assistant:

bool tbl_IsVictory(void)
{
  for (ECardColor_t cc = CC_SPADES; cc <= CC_DIAMONDS; cc++) {
    const Card_t* cardPtr = stk_CTopCard(&ColorStacks[cc]);
    if (!cardPtr || cardPtr->m_type != CT_KING) {
      return false;
    }
  }
  return true;
}